

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O2

char * __thiscall
tetgenio::readnumberline(tetgenio *this,char *string,FILE *infile,char *infilename)

{
  byte *pbVar1;
  ulong uVar2;
  
LAB_0010775e:
  pbVar1 = (byte *)fgets(string,0x800,(FILE *)infile);
  if (pbVar1 == (byte *)0x0) {
    return (char *)0x0;
  }
  do {
    uVar2 = (ulong)*pbVar1;
    if (uVar2 < 0x2f) {
      if ((0x680000000000U >> (uVar2 & 0x3f) & 1) != 0) {
        return (char *)pbVar1;
      }
      if ((0x800000001U >> (uVar2 & 0x3f) & 1) != 0) goto LAB_0010775e;
    }
    if (0xf5 < (byte)(*pbVar1 - 0x3a)) {
      return (char *)pbVar1;
    }
    pbVar1 = pbVar1 + 1;
  } while( true );
}

Assistant:

char* tetgenio::readnumberline(char *string, FILE *infile, char *infilename)
{
  char *result;

  // Search for something that looks like a number.
  do {
    result = fgets(string, INPUTLINESIZE, infile);
    if (result == (char *) NULL) {
      return result;
    }
    // Skip anything that doesn't look like a number, a comment, 
    //   or the end of a line. 
    while ((*result != '\0') && (*result != '#')
           && (*result != '.') && (*result != '+') && (*result != '-')
           && ((*result < '0') || (*result > '9'))) {
      result++;
    }
    // If it's a comment or end of line, read another line and try again.
  } while ((*result == '#') || (*result == '\0'));
  return result;
}